

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O0

string * __thiscall blc::network::SSLSocket::getAddress_abi_cxx11_(SSLSocket *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x48));
  return in_RDI;
}

Assistant:

std::string blc::network::SSLSocket::getAddress() const {
	return (this->_address);
}